

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

PatternList *
parse_argv(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options,bool options_first)

{
  bool bVar1;
  string *__lhs;
  allocator local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *local_58;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = options;
  do {
    while( true ) {
      while( true ) {
        if ((ulong)((long)(tokens->fTokens).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokens->fTokens).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= tokens->fIndex) {
          return __return_storage_ptr__;
        }
        __lhs = Tokens::current_abi_cxx11_(tokens);
        bVar1 = std::operator==(__lhs,"--");
        if (!bVar1) break;
        while (tokens->fIndex <
               (ulong)((long)(tokens->fTokens).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(tokens->fTokens).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          Tokens::pop_abi_cxx11_(&local_50,tokens);
          std::make_shared<docopt::Argument,char_const(&)[1],std::__cxx11::string>
                    ((char (*) [1])local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ae619);
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::emplace_back<std::shared_ptr<docopt::Argument>>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)__return_storage_ptr__,(shared_ptr<docopt::Argument> *)local_68);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      std::__cxx11::string::string((string *)&local_50,"--",local_68);
      bVar1 = anon_unknown.dwarf_192162::starts_with(__lhs,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) break;
      parse_long((PatternList *)&local_50,tokens,local_58);
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<std::shared_ptr<docopt::Pattern>*,std::back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                ((shared_ptr<docopt::Pattern> *)local_50._M_dataplus._M_p,
                 (shared_ptr<docopt::Pattern> *)local_50._M_string_length,
                 (back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                  )__return_storage_ptr__);
LAB_0019b0b8:
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)&local_50);
    }
    if (*(__lhs->_M_dataplus)._M_p == '-') {
      bVar1 = std::operator!=(__lhs,"-");
      if (bVar1) {
        parse_short((PatternList *)&local_50,tokens,local_58);
        std::__copy_move<true,false,std::random_access_iterator_tag>::
        __copy_m<std::shared_ptr<docopt::Pattern>*,std::back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                  ((shared_ptr<docopt::Pattern> *)local_50._M_dataplus._M_p,
                   (shared_ptr<docopt::Pattern> *)local_50._M_string_length,
                   (back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                    )__return_storage_ptr__);
        goto LAB_0019b0b8;
      }
    }
    if (options_first) {
      while (tokens->fIndex <
             (ulong)((long)(tokens->fTokens).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(tokens->fTokens).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        Tokens::pop_abi_cxx11_(&local_50,tokens);
        std::make_shared<docopt::Argument,char_const(&)[1],std::__cxx11::string>
                  ((char (*) [1])local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ae619);
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Argument>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)__return_storage_ptr__,(shared_ptr<docopt::Argument> *)local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      Tokens::pop_abi_cxx11_(&local_50,tokens);
      std::make_shared<docopt::Argument,char_const(&)[1],std::__cxx11::string>
                ((char (*) [1])local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ae619);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Argument>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)__return_storage_ptr__,(shared_ptr<docopt::Argument> *)local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      std::__cxx11::string::~string((string *)&local_50);
    }
  } while( true );
}

Assistant:

PatternList parse_argv(Tokens tokens, std::vector<Option>& options, bool options_first)
{
	// Parse command-line argument vector.
	//
	// If options_first:
	//    argv ::= [ long | shorts ]* [ argument ]* [ '--' [ argument ]* ] ;
	// else:
	//    argv ::= [ long | shorts | argument ]* [ '--' [ argument ]* ] ;
	
	PatternList ret;
	while (tokens) {
		auto const& token = tokens.current();
		
		if (token=="--") {
			// option list is done; convert all the rest to arguments
			while (tokens) {
				ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
			}
		} else if (starts_with(token, "--")) {
			auto&& parsed = parse_long(tokens, options);
			std::move(parsed.begin(), parsed.end(), std::back_inserter(ret));
		} else if (token[0]=='-' && token != "-") {
			auto&& parsed = parse_short(tokens, options);
			std::move(parsed.begin(), parsed.end(), std::back_inserter(ret));
		} else if (options_first) {
			// option list is done; convert all the rest to arguments
			while (tokens) {
				ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
			}
		} else {
			ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
		}
	}
	
	return ret;
}